

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.c
# Opt level: O0

void uv__random_done(uv__work *w,int status)

{
  uv_random_t *req;
  int status_local;
  uv__work *w_local;
  
  if (*(int *)(w[-1].work + 0x20) != 0) {
    *(int *)(w[-1].work + 0x20) = *(int *)(w[-1].work + 0x20) + -1;
    req._4_4_ = status;
    if (status == 0) {
      req._4_4_ = *(int *)&w[-1].done;
    }
    (*(code *)w[-1].wq[1])(&w[-3].loop,req._4_4_,w[-1].loop,w[-1].wq[0]);
    return;
  }
  __assert_fail("uv__has_active_reqs(req->loop)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/random.c"
                ,0x55,"void uv__random_done(struct uv__work *, int)");
}

Assistant:

static void uv__random_done(struct uv__work* w, int status) {
  uv_random_t* req;

  req = container_of(w, uv_random_t, work_req);
  uv__req_unregister(req->loop, req);

  if (status == 0)
    status = req->status;

  req->cb(req, status, req->buf, req->buflen);
}